

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O2

size_t __thiscall ot::commissioner::coap::Message::GetHeaderLength(Message *this)

{
  Message *in_RSI;
  size_t sVar1;
  ByteArray buf;
  Error error;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  undefined1 local_38 [40];
  
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Serialize((Error *)local_38,in_RSI,&this->mHeader,(ByteArray *)&local_58);
  if (local_38._0_4_ == kNone) {
    sVar1 = (long)local_58._M_impl.super__Vector_impl_data._M_finish -
            (long)local_58._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::~string((string *)(local_38 + 8));
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_58);
    return sVar1;
  }
  __assert_fail("condition",
                "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap.cpp"
                ,0xb9,"size_t ot::commissioner::coap::Message::GetHeaderLength() const");
}

Assistant:

size_t Message::GetHeaderLength() const
{
    ByteArray buf;
    Error     error = Serialize(mHeader, buf);

    ASSERT(error == ErrorCode::kNone);
    return buf.size();
}